

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_instr.c
# Opt level: O1

void fill_arm_lut(arminstr_handler_t (*lut) [4096])

{
  arm_instr_type_t aVar1;
  uint32_t i;
  long lVar2;
  
  lVar2 = 0;
  do {
    aVar1 = get_arm_instr_type_hash((uint32_t)lVar2);
    (*lut)[lVar2] = (arminstr_handler_t)(&PTR_data_processing_00130c90)[aVar1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1000);
  return;
}

Assistant:

void fill_arm_lut(arminstr_handler_t (*lut)[4096]) {
    for (word i = 0; i < 4096; i++) {
        arm_instr_type_t type = get_arm_instr_type_hash(i);
        switch (type) {
            case DATA_PROCESSING:
                (*lut)[i] = &data_processing;
                break;
            case STATUS_TRANSFER:
                (*lut)[i] = &psr_transfer;
                break;
            case MULTIPLY:
                (*lut)[i] = &multiply;
                break;
            case MULTIPLY_LONG:
                (*lut)[i] = &multiply_long;
                break;
            case SINGLE_DATA_SWAP:
                (*lut)[i] = &single_data_swap;
                break;
            case BRANCH_EXCHANGE:
                (*lut)[i] = &branch_exchange;
                break;
            case HALFWORD_DT_RO:
                (*lut)[i] = &halfword_dt_ro;
                break;
            case HALFWORD_DT_IO:
                (*lut)[i] = &halfword_dt_io;
                break;
            case SINGLE_DATA_TRANSFER:
                (*lut)[i] = &single_data_transfer;
                break;
            case UNDEFINED:
                (*lut)[i] = &unknown_instr_undefined;
                break;
            case BLOCK_DATA_TRANSFER:
                (*lut)[i] = &block_data_transfer;
                break;
            case BRANCH:
                (*lut)[i] = &branch;
                break;
            case COPROCESSOR_DATA_TRANSFER:
                (*lut)[i] = &unknown_instr_coprocessor_data_transfer;
                break;
            case COPROCESSOR_DATA_OPERATION:
                (*lut)[i] = &unknown_instr_coprocessor_data_operation;
                break;
            case COPROCESSOR_REGISTER_TRANSFER:
                (*lut)[i] = &unknown_instr_coprocessor_register_transfer;
                break;
            case SOFTWARE_INTERRUPT:
                (*lut)[i] = &arm_software_interrupt;
                break;
            default:
                logfatal("Hit default case in fill_arm_lut switch. This should never happen!")
        }
    }
}